

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# functions.cpp
# Opt level: O3

double Functions::getValue(double x,Activation func,bool derivative)

{
  bool bVar1;
  double dVar2;
  
  switch(func) {
  default:
    if (derivative) {
      x = (1.0 - x) * x;
    }
    else {
      dVar2 = exp(-x);
      x = 1.0 / (dVar2 + 1.0);
    }
    break;
  case RELU:
    if (!derivative) {
      if (0.0 < x) {
        return x;
      }
      return 0.0;
    }
    bVar1 = 0.0 < x;
    goto LAB_0010244c;
  case IDENTITY:
    if (derivative) {
      x = 1.0;
    }
    break;
  case BINARY:
    if (derivative) {
      return 0.0;
    }
    bVar1 = 0.0 <= x;
LAB_0010244c:
    x = (double)(-(ulong)bVar1 & 0x3ff0000000000000);
    break;
  case TANH:
    x = tanh(x);
    if (derivative) {
      x = 1.0 - x * x;
    }
  }
  return x;
}

Assistant:

double Functions::getValue(double x, Activation func, bool derivative) {
	switch (func) {
	case SIGMOID:
		return derivative ? derivativeSigmoid(x) : sigmoid(x);
	case RELU:
		return derivative ? derivativeRelu(x) : relu(x);
	case IDENTITY:
		return derivative ? derivativeIdentity(x) : identity(x);
	case BINARY:
		return derivative ? derivativeBinary(x) : binary(x);
	case TANH:
		return derivative ? derivativeTanh(x) : tanh(x);
	default:
		return derivative ? derivativeSigmoid(x) : sigmoid(x);
	}
}